

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcCostItem::~IfcCostItem(IfcCostItem *this,void **vtt)

{
  void **vtt_local;
  IfcCostItem *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCostItem,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcCostItem,_0UL> *)
             &(this->super_IfcControl).super_IfcObject.field_0xe0,vtt + 0x17);
  IfcControl::~IfcControl(&this->super_IfcControl,vtt + 1);
  return;
}

Assistant:

IfcCostItem() : Object("IfcCostItem") {}